

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O3

Dims * __thiscall
adios2::core::VariableBase::Shape(Dims *__return_storage_ptr__,VariableBase *this,size_t step)

{
  _Rb_tree_header *p_Var1;
  Engine *pEVar2;
  pointer puVar3;
  int iVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Dims *__x;
  ulong uVar7;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Shape","");
  CheckRandomAccess(this,step,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pEVar2 = this->m_Engine;
  if (pEVar2 != (Engine *)0x0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = (*pEVar2->_vptr_Engine[0xd])(pEVar2,this,step,__return_storage_ptr__);
    if ((char)iVar4 != '\0') {
      return __return_storage_ptr__;
    }
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
  }
  if (((step != 0xffffffffffffffff || this->m_FirstStreamingStep != true) &&
      (this->m_Engine != (Engine *)0x0)) && (this->m_ShapeID == GlobalArray)) {
    if (this->m_FirstStreamingStep == false) {
      iVar4 = (*this->m_Engine->_vptr_Engine[4])();
      step = CONCAT44(extraout_var,iVar4);
    }
    p_Var6 = (this->m_AvailableShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      uVar7 = step + 1;
      p_Var1 = &(this->m_AvailableShapes)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var6 + 1) >= uVar7) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar7];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= uVar7)) {
        __x = (Dims *)&p_Var5[1]._M_parent;
        goto LAB_003e5cd1;
      }
    }
  }
  __x = &this->m_Shape;
LAB_003e5cd1:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

Dims VariableBase::Shape(const size_t step) const
{
    CheckRandomAccess(step, "Shape");

    if (m_Engine)
    {
        Dims tmp;
        // see if the engine implements Variable Shape inquiry
        if (m_Engine->VarShape(*this, step, tmp))
            return tmp;
    }
    if (m_FirstStreamingStep && step == adios2::EngineCurrentStep)
    {
        return m_Shape;
    }

    if (m_Engine != nullptr && m_ShapeID == ShapeID::GlobalArray)
    {
        const size_t stepInput = !m_FirstStreamingStep ? m_Engine->CurrentStep() : step;

        const auto it = m_AvailableShapes.find(stepInput + 1);
        if (it != m_AvailableShapes.end())
        {
            return it->second;
        }
    }
    return m_Shape;
}